

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::IfStmt::set_predicate(IfStmt *this,shared_ptr<kratos::Var> *var)

{
  element_type *peVar1;
  uint32_t width;
  int iVar2;
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  (*(((this->predicate_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->super_Stmt).super_IRNode._vptr_IRNode[0xc])();
  if ((((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
      ast_node_type_ == VarKind) {
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>,
               &var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
    width = (*(((this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_IRNode)._vptr_IRNode[0xd])();
    iVar2 = (*(((this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_IRNode)._vptr_IRNode[7])();
    Generator::get_auxiliary_var((Generator *)(local_48 + 0x10),width,SUB41(iVar2,0));
    Var::assign((Var *)local_48,(shared_ptr<kratos::Var> *)local_48._16_8_);
    std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->predicate_stmt_).
                super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    peVar1 = (this->predicate_stmt_).
             super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar1->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar1,this);
    return;
  }
  __assert_fail("var->ir_node_kind() == IRNodeKind::VarKind",
                "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/stmt.cc",0xf7,
                "void kratos::IfStmt::set_predicate(const std::shared_ptr<Var> &)");
}

Assistant:

void IfStmt::set_predicate(const std::shared_ptr<Var> &var) {
    predicate_stmt_->clear();
    assert(var->ir_node_kind() == IRNodeKind::VarKind);
    predicate_ = var;
    predicate_stmt_ =
        predicate_->generator()->get_auxiliary_var(predicate_->width())->assign(predicate_);
    predicate_stmt_->set_parent(this);
}